

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  SyntaxList<slang::syntax::ProductionSyntax> *args_6;
  RandSequenceStatementSyntax *pRVar1;
  NamedLabelSyntax *local_88;
  DeepCloneVisitor visitor;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_88 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_88 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),&visitor,(BumpAllocator *)__child_stack);
  }
  args_1 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x88),(BumpAllocator *)__child_stack);
  args_6 = deepClone<slang::syntax::ProductionSyntax>
                     ((SyntaxList<slang::syntax::ProductionSyntax> *)(__fn + 0x98),
                      (BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0xd0),(BumpAllocator *)__child_stack);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RandSequenceStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_88,args_1,(Token *)&visitor,&local_40,
                      &local_50,&local_60,args_6,&local_70);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RandSequenceStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RandSequenceStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.randsequence.deepClone(alloc),
        node.openParen.deepClone(alloc),
        node.firstProduction.deepClone(alloc),
        node.closeParen.deepClone(alloc),
        *deepClone(node.productions, alloc),
        node.endsequence.deepClone(alloc)
    );
}